

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::GenerateMembers
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *pFVar1;
  bool bVar2;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view end_varname;
  string_view end_varname_00;
  LogMessageFatal local_178;
  Options local_168;
  Options local_118;
  Options local_c8;
  Options local_78;
  
  variables = &(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_;
  PrintExtraFieldInfo(variables,printer);
  bVar2 = FieldDescriptor::has_presence
                    ((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  if (bVar2) {
    pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
    Options::Options(&local_78,
                     &((this->super_ImmutablePrimitiveFieldLiteGenerator).context_)->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_78,false,false,false);
    Options::~Options(&local_78);
    text._M_str = 
    "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
    ;
    text._M_len = 0x75;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text);
    begin_varname._M_str = "{";
    begin_varname._M_len = 1;
    end_varname._M_str = "}";
    end_varname._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname,end_varname,
               (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
    Options::Options(&local_c8,
                     &((this->super_ImmutablePrimitiveFieldLiteGenerator).context_)->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,GETTER,&local_c8,false,false,false);
    Options::~Options(&local_c8);
    text_00._M_str =
         "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    return ($boxed_type$) $oneof_name$_;\n  }\n  return $default$;\n}\n"
    ;
    text_00._M_len = 0xb4;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_00);
    begin_varname_00._M_str = "{";
    begin_varname_00._M_len = 1;
    end_varname_00._M_str = "}";
    end_varname_00._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_00,end_varname_00,
               (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
    Options::Options(&local_118,
                     &((this->super_ImmutablePrimitiveFieldLiteGenerator).context_)->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,SETTER,&local_118,false,false,true);
    Options::~Options(&local_118);
    text_01._M_str =
         "private void set$capitalized_name$($type$ value) {\n$null_check$  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n}\n"
    ;
    text_01._M_len = 0x76;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_01);
    pFVar1 = (this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_;
    Options::Options(&local_168,
                     &((this->super_ImmutablePrimitiveFieldLiteGenerator).context_)->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,&local_168,false,false,true);
    Options::~Options(&local_168);
    text_02._M_str =
         "private void clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
    ;
    text_02._M_len = 0x8b;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,variables,text_02);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/primitive_field.cc"
             ,0x16d,"descriptor_->has_presence()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_178);
}

Assistant:

void ImmutablePrimitiveOneofFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  ABSL_DCHECK(descriptor_->has_presence());
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    return ($boxed_type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $default$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void set$capitalized_name$($type$ value) {\n"
                 "$null_check$"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    $clear_oneof_case_message$;\n"
                 "    $oneof_name$_ = null;\n"
                 "  }\n"
                 "}\n");
}